

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

void FastPForLib::Simple16<false>::unpack14_2(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *puVar2 >> 0xe & 0x3fff;
  puVar1[1] = *puVar2 & 0x3fff;
  *in = puVar2 + 1;
  *out = puVar1 + 2;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack14_2(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 14) & 0x3fff;
  pout[1] = pin[0] & 0x3fff;

  *in = pin + 1;
  *out = pout + 2;
}